

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_param_tests.hpp
# Opt level: O3

iuParamGenerator<float> __thiscall iutest::CSV<float>(iutest *this,char *path,char delimiter)

{
  iuCsvFileParamsGenerator<float> *this_00;
  _Interface *extraout_RDX;
  _Interface *extraout_RDX_00;
  _Interface *p_Var1;
  iuParamGenerator<float> iVar2;
  allocator<char> local_41;
  string local_40;
  
  this_00 = (iuCsvFileParamsGenerator<float> *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,path,&local_41);
  detail::iuCsvFileParamsGenerator<float>::iuCsvFileParamsGenerator(this_00,&local_40,delimiter);
  *(undefined ***)this = &PTR__iuIParamGenerator_0013e980;
  *(iuCsvFileParamsGenerator<float> **)(this + 8) = this_00;
  p_Var1 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    p_Var1 = extraout_RDX_00;
  }
  iVar2.m_pInterface = p_Var1;
  iVar2.super_iuIParamGenerator<int>._vptr_iuIParamGenerator = (_func_int **)this;
  return iVar2;
}

Assistant:

detail::iuParamGenerator<T> IUTEST_ATTRIBUTE_UNUSED_ CSV(const char* path, char delimiter = ',')
{
    return new detail::iuCsvFileParamsGenerator<T>(path, delimiter);
}